

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ScatterAlongAxisLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_scatteralongaxis(NeuralNetworkLayer *this)

{
  bool bVar1;
  ScatterAlongAxisLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_scatteralongaxis(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_scatteralongaxis(this);
    this_00 = (ScatterAlongAxisLayerParams *)operator_new(0x20);
    ScatterAlongAxisLayerParams::ScatterAlongAxisLayerParams(this_00);
    (this->layer_).scatteralongaxis_ = this_00;
  }
  return (ScatterAlongAxisLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ScatterAlongAxisLayerParams* NeuralNetworkLayer::mutable_scatteralongaxis() {
  if (!has_scatteralongaxis()) {
    clear_layer();
    set_has_scatteralongaxis();
    layer_.scatteralongaxis_ = new ::CoreML::Specification::ScatterAlongAxisLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.scatterAlongAxis)
  return layer_.scatteralongaxis_;
}